

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snestistics.cpp
# Opt level: O0

void branch_report(ReportWriter *writer,RomAccessor *rom,Trace *op_trace,
                  AnnotationResolver *annotations)

{
  int pc_00;
  bool bVar1;
  uint8_t operand;
  undefined8 uVar2;
  Pointer local_1074;
  Annotation *local_1070;
  Annotation *target_annotation;
  Annotation *source_annotation;
  Pointer target;
  int myloop;
  uint8_t opcode;
  reference ppStack_1050;
  Pointer pc;
  pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup> *it;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_int,_snestistics::Trace::OpVariantLookup,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>_>
  *__range1;
  StringBuilder sb;
  AnnotationResolver *annotations_local;
  Trace *op_trace_local;
  RomAccessor *rom_local;
  ReportWriter *writer_local;
  
  sb._4092_8_ = annotations;
  snestistics::StringBuilder::StringBuilder((StringBuilder *)((long)&__range1 + 4));
  ReportWriter::writeSeperator(writer,"Branch analysis");
  ReportWriter::writeComment
            (writer,
             "NOTE: Branches between two functions could mean that they really are one function.");
  ReportWriter::writeComment
            (writer,
             "      Branches out from a function could mean that the function is larger than tagged."
            );
  ReportWriter::writeComment
            (writer,"      This report was generated AFTER extra branches were predicted.");
  ReportWriter::writeComment(writer,"");
  snestistics::StringBuilder::clear((StringBuilder *)((long)&__range1 + 4));
  __end1 = std::
           map<unsigned_int,_snestistics::Trace::OpVariantLookup,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>_>
           ::begin(&op_trace->ops);
  it = (pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup> *)
       std::
       map<unsigned_int,_snestistics::Trace::OpVariantLookup,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>_>
       ::end(&op_trace->ops);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&it);
    if (!bVar1) {
      return;
    }
    ppStack_1050 = std::
                   _Rb_tree_const_iterator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>
                   ::operator*(&__end1);
    myloop = ppStack_1050->first;
    target._3_1_ = snestistics::RomAccessor::evalByte(rom,myloop);
    if ((snestistics::branches[target._3_1_] & 1) != 0) {
      for (source_annotation._4_4_ = 0; pc_00 = myloop, source_annotation._4_4_ < 2;
          source_annotation._4_4_ = source_annotation._4_4_ + 1) {
        if (source_annotation._4_4_ == 0) {
          operand = snestistics::RomAccessor::evalByte(rom,myloop + 1);
          local_1074 = snestistics::branch8(pc_00,operand);
        }
        else {
          local_1074 = myloop + 2;
        }
        source_annotation._0_4_ = local_1074;
        if ((source_annotation._4_4_ == 1) && (target._3_1_ == 0x80)) break;
        target_annotation = (Annotation *)0x0;
        local_1070 = (Annotation *)0x0;
        snestistics::AnnotationResolver::resolve_annotation
                  ((AnnotationResolver *)sb._4092_8_,myloop,&target_annotation,(Annotation **)0x0);
        snestistics::AnnotationResolver::resolve_annotation
                  ((AnnotationResolver *)sb._4092_8_,(Pointer)source_annotation,&local_1070,
                   (Annotation **)0x0);
        if ((target_annotation != (Annotation *)0x0) && (target_annotation != local_1070)) {
          snestistics::StringBuilder::clear((StringBuilder *)((long)&__range1 + 4));
          uVar2 = std::__cxx11::string::c_str();
          snestistics::StringBuilder::format
                    ((StringBuilder *)((long)&__range1 + 4),"Branch going from %s",uVar2);
          if (local_1070 != (Annotation *)0x0) {
            uVar2 = std::__cxx11::string::c_str();
            snestistics::StringBuilder::format
                      ((StringBuilder *)((long)&__range1 + 4)," to %s",uVar2);
          }
          snestistics::StringBuilder::format
                    ((StringBuilder *)((long)&__range1 + 4)," [%06X->%06X]",(ulong)(uint)myloop,
                     (ulong)(Pointer)source_annotation);
          ReportWriter::writeComment(writer,(StringBuilder *)((long)&__range1 + 4));
        }
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

void branch_report(ReportWriter &writer, const RomAccessor &rom, const Trace &op_trace, const AnnotationResolver &annotations) {
	StringBuilder sb;
	writer.writeSeperator("Branch analysis");
	writer.writeComment("NOTE: Branches between two functions could mean that they really are one function.");
	writer.writeComment("      Branches out from a function could mean that the function is larger than tagged.");
	writer.writeComment("      This report was generated AFTER extra branches were predicted.");
	writer.writeComment("");

	sb.clear();

	for (const auto &it : op_trace.ops) {
		const Pointer pc = it.first;
		uint8_t opcode = rom.evalByte(pc);
		if (!branches[opcode])
			continue;

		for (int myloop = 0; myloop < 2; myloop++) {
			Pointer target = myloop == 0 ? branch8(pc, rom.evalByte(pc+1)) : pc + 2;
			if (myloop == 1 && opcode == 0x80)
				break;

			const Annotation *source_annotation = nullptr, *target_annotation = nullptr;
			annotations.resolve_annotation(pc,     &source_annotation);
			annotations.resolve_annotation(target, &target_annotation);

			if (!source_annotation || source_annotation == target_annotation)
				continue;

			sb.clear();
			sb.format("Branch going from %s", source_annotation->name.c_str());
						
			if (target_annotation) {
				sb.format(" to %s", target_annotation->name.c_str());
			}
			sb.format(" [%06X->%06X]", pc, target);
			writer.writeComment(sb);
		}
	}
}